

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector
          (quad_value_bit_vector *this,int N_,string *str_raw)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong in_RDX;
  undefined4 in_ESI;
  vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *in_RDI;
  int i_2;
  int ind;
  uchar val;
  int i_1;
  int len;
  int i;
  string str;
  int num_digits;
  undefined8 in_stack_ffffffffffffff78;
  quad_value_bit_vector *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int local_68;
  int local_5c;
  int local_44;
  string local_40 [36];
  int local_1c;
  ulong local_18;
  undefined4 local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::vector
            ((vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *)0x23eda0);
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
    super__Vector_impl_data._M_start = local_c;
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  local_44 = 0;
  do {
    iVar2 = local_44;
    iVar1 = std::__cxx11::string::size();
    if (iVar1 <= iVar2) {
      if (local_1c <=
          *(int *)&in_RDI[1].super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
        iVar1 = std::__cxx11::string::size();
        std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
                  (in_RDI,CONCAT44(iVar2,in_stack_ffffffffffffff88));
        local_5c = iVar1;
        while (local_5c = local_5c + -1, -1 < local_5c) {
          in_stack_ffffffffffffff80 =
               (quad_value_bit_vector *)std::__cxx11::string::operator[]((ulong)local_40);
          in_stack_ffffffffffffff78 = std::__cxx11::string::operator[]((ulong)local_40);
          std::__cxx11::string::operator[]((ulong)local_40);
          set(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
              (int)in_stack_ffffffffffffff78);
        }
        local_68 = *(int *)&in_RDI[1].
                            super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                            _M_impl.super__Vector_impl_data._M_start;
        while (local_68 = local_68 + -1, iVar1 <= local_68) {
          set(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
              (int)in_stack_ffffffffffffff78);
        }
        std::__cxx11::string::~string(local_40);
        return;
      }
      __assert_fail("num_digits <= N",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                    ,0x180,
                    "bsim::quad_value_bit_vector::quad_value_bit_vector(const int, const std::string &)"
                   );
    }
    pcVar3 = (char *)std::__cxx11::string::operator[](local_18);
    iVar2 = isdigit((int)*pcVar3);
    if (iVar2 == 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[](local_18);
      if (*pcVar3 == 'z') {
        pcVar3 = (char *)std::__cxx11::string::operator[](local_18);
        std::__cxx11::string::operator+=(local_40,*pcVar3);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[](local_18);
        if (*pcVar3 == 'x') {
          pcVar3 = (char *)std::__cxx11::string::operator[](local_18);
          std::__cxx11::string::operator+=(local_40,*pcVar3);
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[](local_18);
          if (*pcVar3 != '_') {
            __assert_fail("str_raw[i] == \'_\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                          ,0x17d,
                          "bsim::quad_value_bit_vector::quad_value_bit_vector(const int, const std::string &)"
                         );
          }
        }
      }
    }
    else {
      local_1c = local_1c + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[](local_18);
      std::__cxx11::string::operator+=(local_40,*pcVar3);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

quad_value_bit_vector(const int N_, const std::string& str_raw) : N(N_) {
      int num_digits = 0;
      std::string str;
      for (int i = 0; i < ((int) str_raw.size()); i++) {
	if (isdigit(str_raw[i])) {
	  num_digits++;
	  str += str_raw[i];
	} else if (str_raw[i] == 'z') {
          str += str_raw[i];
        } else if (str_raw[i] == 'x') {
          str += str_raw[i];
        } else {
	  assert(str_raw[i] == '_');
	}
      }
      assert(num_digits <= N);

      int len = str.size();      

      bits.resize(N);
      for (int i = len - 1; i >= 0; i--) {
        unsigned char val = (str[i] == '0') ? 0 : 1;
        if (str[i] == 'x') {
          val = QBV_UNKNOWN_VALUE;
        }
        if (str[i] == 'z') {
          val = QBV_HIGH_IMPEDANCE_VALUE;
        }

        int ind = len - i - 1;
        set(ind, val);
      }
      for (int i = N - 1; i >= len; i--) {
        set(i,0);
      }
    }